

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

int makeFileById(int id,string *name,string *str)

{
  inode *piVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  inode *piVar5;
  int *piVar6;
  ulong uVar7;
  char t [252];
  
  lVar2 = 0x11;
  piVar1 = inodes + (long)inodes[id].i_blocks[0] * 0x80 + 0xff8;
  do {
    piVar5 = piVar1;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      return 0;
    }
    piVar1 = piVar5 + 8;
  } while ((char)piVar5[8].i_id != '\0');
  strcpy(t,(name->_M_dataplus)._M_p);
  strcpy((char *)(piVar5 + 8),t);
  piVar6 = &inodes[0].i_mode;
  for (uVar3 = 0; uVar3 != 0x1000; uVar3 = uVar3 + 1) {
    if (super_block.inode_bitmap[uVar3] == false) {
      *(int *)(piVar5[0xf].i_place_holder + 0xc) = (int)uVar3;
      *piVar6 = 2;
      super_block.inode_bitmap[uVar3] = true;
      goto LAB_001031c2;
    }
    piVar6 = piVar6 + 8;
  }
  uVar3 = 0x1000;
LAB_001031c2:
  lVar2 = 0;
  do {
    if (lVar2 == 0x1000) {
      lVar2 = 0x1000;
LAB_001031f9:
      for (uVar7 = 0; uVar7 < str->_M_string_length; uVar7 = uVar7 + 1) {
        emptyspaces[uVar7 + lVar2 * 0x1000] = (str->_M_dataplus)._M_p[uVar7];
      }
      iVar4 = (int)str->_M_string_length;
      inodes[uVar3 & 0xffffffff].i_file_size = iVar4;
      for (; id != 0; id = *(int *)(emptyspaces + (long)inodes[id].i_blocks[0] * 0x1000 + 0x1fc)) {
        inodes[id].i_file_size = inodes[id].i_file_size + iVar4;
      }
      inodes[0].i_file_size = inodes[0].i_file_size + iVar4;
      return (int)uVar3;
    }
    if (super_block.block_bitmap[lVar2] == false) {
      inodes[uVar3 & 0xffffffff].i_blocks[0] = (int)lVar2;
      super_block.block_bitmap[lVar2] = true;
      goto LAB_001031f9;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int makeFileById(int id, string name, string str) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    bool isfull = true;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "") == 0) {//找到空的目录项
            isfull = false;
            char t[252];
            strcpy(t, name.c_str());
            strcpy(p->dirs[i].name, t);//名字
            break;
        }
    }
    if(isfull){
        return 0;
    }
    int j;
    for (j = 0; j < 4096; j++) {
        if (!super_block.inode_bitmap[j]) {
            p->dirs[i].inode_id = j;
            inodes[j].i_mode = A_FILE;
            super_block.inode_bitmap[j] = true;
            break;
        }
    }
    int k;
    for (k = 0; k < 4096; k++) {
        if (!super_block.block_bitmap[k]) {
            inodes[j].i_blocks[0] = k;
            super_block.block_bitmap[k] = true;
            break;
        }
    }
    File_Block *q = getAddressByLocation_File(k);
    for (int m = 0; m < str.size(); m++) {
        q->data[m] = str[m];
    }
    inodes[j].i_file_size = str.size();//文件大小
    int cur = id;
    while (cur)
    {
        inodes[cur].i_file_size += str.size();
        cur = getParentById(cur);
    }
    inodes[0].i_file_size += str.size();
    return j;
}